

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ensureBits9(LodePNGBitReader *reader,size_t nbits)

{
  ulong uVar1;
  size_t size;
  size_t start;
  size_t nbits_local;
  LodePNGBitReader *reader_local;
  
  uVar1 = reader->bp >> 3;
  if (uVar1 + 1 < reader->size) {
    reader->buffer = (uint)CONCAT11(reader->data[uVar1 + 1],reader->data[uVar1]);
    reader->buffer = reader->buffer >> ((byte)reader->bp & 7);
    reader_local._4_4_ = 1;
  }
  else {
    reader->buffer = 0;
    if (uVar1 < reader->size) {
      reader->buffer = (uint)reader->data[uVar1] | reader->buffer;
    }
    reader->buffer = reader->buffer >> ((byte)reader->bp & 7);
    reader_local._4_4_ = (uint)(reader->bp + nbits <= reader->bitsize);
  }
  return reader_local._4_4_;
}

Assistant:

static unsigned ensureBits9(LodePNGBitReader* reader, size_t nbits) {
  size_t start = reader->bp >> 3u;
  size_t size = reader->size;
  if(start + 1u < size) {
    reader->buffer = (unsigned)reader->data[start + 0] | ((unsigned)reader->data[start + 1] << 8u);
    reader->buffer >>= (reader->bp & 7u);
    return 1;
  } else {
    reader->buffer = 0;
    if(start + 0u < size) reader->buffer |= reader->data[start + 0];
    reader->buffer >>= (reader->bp & 7u);
    return reader->bp + nbits <= reader->bitsize;
  }
}